

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrSpaceFilterInfoBaseHeaderFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  bool bVar2;
  XrInstance pXVar3;
  invalid_argument *this;
  string *this_00;
  string next_prefix;
  string type_prefix;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (value->type == XR_TYPE_SPACE_COMPONENT_FILTER_INFO_FB) {
    std::__cxx11::string::string((string *)&local_90,(string *)prefix);
    std::__cxx11::string::string((string *)&local_b0,(string *)type_string);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,(XrSpaceComponentFilterInfoFB *)value,&local_90,&local_b0,
                       is_pointer,contents);
    std::__cxx11::string::~string((string *)&local_b0);
    this_00 = &local_90;
  }
  else {
    if (value->type != XR_TYPE_SPACE_UUID_FILTER_INFO_FB) {
      PointerToHexString<XrSpaceFilterInfoBaseHeaderFB>
                ((XrSpaceFilterInfoBaseHeaderFB *)next_prefix._M_dataplus._M_p);
      std::
      vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
                ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                  *)contents,type_string,prefix,&next_prefix);
      std::__cxx11::string::~string((string *)&next_prefix);
      std::__cxx11::string::append((char *)prefix);
      std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&type_prefix);
      if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
        std::__cxx11::to_string(&next_prefix,value->type);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [16])"XrStructureType",&type_prefix,&next_prefix);
        std::__cxx11::string::~string((string *)&next_prefix);
      }
      else {
        next_prefix.field_2._M_allocated_capacity = 0;
        next_prefix.field_2._8_8_ = 0;
        next_prefix._M_dataplus._M_p = (pointer)0x0;
        next_prefix._M_string_length = 0;
        p_Var1 = gen_dispatch_table->StructureTypeToString;
        pXVar3 = FindInstanceFromDispatchTable(gen_dispatch_table);
        (*p_Var1)(pXVar3,value->type,(char *)&next_prefix);
        std::
        vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
        ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
                  ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                    *)contents,(char (*) [16])"XrStructureType",&type_prefix,
                   (char (*) [64])&next_prefix);
      }
      std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
      std::__cxx11::string::append((char *)&next_prefix);
      value_00 = value->next;
      std::__cxx11::string::string((string *)&local_d0,(string *)&next_prefix);
      bVar2 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_d0,contents);
      std::__cxx11::string::~string((string *)&local_d0);
      if (bVar2) {
        std::__cxx11::string::~string((string *)&next_prefix);
        std::__cxx11::string::~string((string *)&type_prefix);
        return true;
      }
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::string::string((string *)&local_50,(string *)prefix);
    std::__cxx11::string::string((string *)&local_70,(string *)type_string);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,(XrSpaceUuidFilterInfoFB *)value,&local_50,&local_70,
                       is_pointer,contents);
    std::__cxx11::string::~string((string *)&local_70);
    this_00 = &local_50;
  }
  std::__cxx11::string::~string((string *)this_00);
  return bVar2;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpaceFilterInfoBaseHeaderFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        if (value->type == XR_TYPE_SPACE_UUID_FILTER_INFO_FB) {
            const XrSpaceUuidFilterInfoFB* new_value = reinterpret_cast<const XrSpaceUuidFilterInfoFB*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        if (value->type == XR_TYPE_SPACE_COMPONENT_FILTER_INFO_FB) {
            const XrSpaceComponentFilterInfoFB* new_value = reinterpret_cast<const XrSpaceComponentFilterInfoFB*>(value);
            return ApiDumpOutputXrStruct(gen_dispatch_table, new_value, prefix, type_string, is_pointer, contents);
        }
        // Fallback path - Just output generic information about the base struct
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}